

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

parser_error parse_buy_flag(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  void *pvVar3;
  char *pcVar4;
  undefined8 *puVar5;
  object_buy *buy;
  wchar_t flag;
  store *s;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar4 = parser_getsym(p,"flag");
    iVar1 = lookup_flag(obj_flags,pcVar4);
    if (iVar1 == 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_FLAG;
    }
    else {
      puVar5 = (undefined8 *)mem_zalloc(0x18);
      puVar5[2] = (long)iVar1;
      pcVar4 = parser_getstr(p,"base");
      wVar2 = tval_find_idx(pcVar4);
      puVar5[1] = (long)wVar2;
      *puVar5 = *(undefined8 *)((long)pvVar3 + 0x78);
      *(undefined8 **)((long)pvVar3 + 0x78) = puVar5;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_buy_flag(struct parser *p) {
	struct store *s = parser_priv(p);
	int flag;

	if (!s)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	flag = lookup_flag(obj_flags, parser_getsym(p, "flag"));

	if (flag == FLAG_END) {
		return PARSE_ERROR_INVALID_FLAG;
	} else {
		struct object_buy *buy = mem_zalloc(sizeof(*buy));

		buy->flag = flag;
		buy->tval = tval_find_idx(parser_getstr(p, "base"));
		buy->next = s->buy;
		s->buy = buy;

		return PARSE_ERROR_NONE;
	}
}